

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastSmS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  byte bVar4;
  bool bVar5;
  unsigned_short uVar6;
  uint16_t uVar7;
  uint32_t decoded_tag;
  uint uVar8;
  char *pcVar9;
  uint *puVar10;
  ulong uVar11;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string_view sVar12;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1d0;
  Arena *local_1c8;
  Arena *arena;
  MicroString *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1b0;
  unsigned_short saved_tag;
  uint64_t local_1a8;
  TcParseTableBase *local_1a0;
  ParseContext *local_198;
  char *local_190;
  MessageLite *local_188;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_180;
  TcFieldData local_178;
  TcFieldData local_170;
  undefined1 local_161;
  ulong uStack_160;
  bool always_return;
  TcParseTableBase *local_158;
  ParseContext *local_150;
  char *local_148;
  MessageLite *local_140;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_138;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_130;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_128;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  utf8_range *local_20;
  
  local_1a8 = hasbits;
  local_1a0 = table;
  local_198 = ctx;
  local_190 = ptr;
  local_188 = msg;
  local_180 = data.field_0;
  uVar6 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_180);
  pMVar2 = local_188;
  pcVar9 = local_190;
  pPVar1 = local_198;
  if (uVar6 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe50);
    pcVar9 = MiniParse(pMVar2,pcVar9,pPVar1,(TcFieldData)aStack_1b0,local_1a0,local_1a8);
    return pcVar9;
  }
  field._6_2_ = UnalignedLoad<unsigned_short>(local_190);
  local_190 = local_190 + 2;
  bVar4 = TcFieldData::hasbit_idx((TcFieldData *)&local_180);
  pMVar2 = local_188;
  local_1a8 = 1L << (bVar4 & 0x3f) | local_1a8;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_180);
  arena = (Arena *)RefAt<google::protobuf::internal::MicroString>(pMVar2,(ulong)uVar7);
  local_1c8 = MessageLite::GetArena(local_188);
  pcVar9 = local_190;
  pPVar1 = local_198;
  if (local_1c8 == (Arena *)0x0) {
    TcFieldData::aux_idx((TcFieldData *)&local_180);
    local_190 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar9,(MicroString *)arena,
                           (Arena *)0x0);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_180);
    local_190 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar9,(MicroString *)arena,local_1c8);
  }
  if (local_190 != (char *)0x0) {
    sVar12 = MicroString::Get((MicroString *)arena);
    local_20 = (utf8_range *)sVar12._M_len;
    sVar12._M_len = (size_t)sVar12._M_str;
    bVar5 = utf8_range::IsStructurallyValid(local_20,sVar12);
    if (!bVar5) {
      decoded_tag = FastDecodeTag(field._6_2_);
      ReportFastUtf8Error(decoded_tag,local_1a0);
    }
    pMVar2 = local_188;
    pcVar9 = local_190;
    pPVar1 = local_198;
    TcFieldData::TcFieldData(&data_local);
    local_138 = data_local.field_0;
    local_140 = pMVar2;
    local_148 = pcVar9;
    local_150 = pPVar1;
    local_158 = local_1a0;
    uStack_160 = local_1a8;
    local_161 = 0;
    bVar5 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar9);
    pMVar2 = local_140;
    pcVar9 = local_148;
    pPVar1 = local_150;
    if (bVar5) {
      TcFieldData::TcFieldData(&local_178);
      this = local_158;
      uVar3 = uStack_160;
      uVar6 = UnalignedLoad<unsigned_short>(pcVar9);
      uVar11 = (ulong)(int)((uint)uVar6 & (uint)this->fast_idx_mask);
      if ((uVar11 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(this,uVar11 >> 3);
        local_128.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar6;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_130.data = local_128.data;
        pcVar9 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar9,pPVar1,(TcFieldData)local_128,this,uVar3);
        return pcVar9;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    TcFieldData::TcFieldData(&local_170);
    if (local_158->has_bits_offset != 0) {
      uVar8 = (uint)uStack_160;
      puVar10 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_158->has_bits_offset);
      *puVar10 = uVar8 | *puVar10;
    }
    return pcVar9;
  }
  anon_unknown_104::EnsureArenaStringIsNotDefault(local_188,arena);
  pMVar2 = local_188;
  pcVar9 = local_190;
  pPVar1 = local_198;
  TcFieldData::TcFieldData((TcFieldData *)&local_1d0);
  pcVar9 = Error(pMVar2,pcVar9,pPVar1,(TcFieldData)local_1d0,local_1a0,local_1a8);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSmS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint16_t, MicroString,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}